

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

int __thiscall Assembler::processAbsoluteAddressingSymbol(Assembler *this,string *line)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  NotDefSymbol *this_00;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_120;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_118;
  undefined4 local_10c;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_108;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_100;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_f8;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  relocationTableEntry rT;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_38;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *line_local;
  Assembler *this_local;
  
  local_20 = line;
  line_local = &this->inputFileName;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
       ::find(&this->symbolTable,line);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
       ::end(&this->symbolTable);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (!bVar1) {
    this_00 = (NotDefSymbol *)__cxa_allocate_exception(8);
    memset(this_00,0,8);
    NotDefSymbol::NotDefSymbol(this_00);
    __cxa_throw(this_00,&NotDefSymbol::typeinfo,NotDefSymbol::~NotDefSymbol);
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
       ::find(&this->symbolTable,line);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
           ::operator->(&local_38);
  if ((ppVar2->second).section == -1) {
    rT.section.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::find(&this->symbolTable,line);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
                           *)((long)&rT.section.field_2 + 8));
    this_local._4_4_ = (ppVar2->second).value;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
    relocationTableEntry::relocationTableEntry
              ((relocationTableEntry *)local_90,0,&local_b0,-1,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    local_90._0_4_ = locationCounter + 3 + local_90._0_4_;
    std::__cxx11::string::operator=((string *)&rT,"R_386_16");
    std::__cxx11::string::operator=((string *)&rT.value,(string *)&currentSectionName_abi_cxx11_);
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
         ::find(&this->symbolTable,line);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
             ::operator->(&local_f8);
    bVar1 = true;
    if (((ppVar2->second).isGlobal & 1U) == 0) {
      local_100._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,line);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(&local_100);
      bVar1 = (ppVar2->second).section == 0;
    }
    if (bVar1) {
      local_108._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,line);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(&local_108);
      rT.typeOfRelocation.field_2._8_4_ = (ppVar2->second).id;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
               ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
      std::__cxx11::
      list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>::
      push_back(pmVar3,(value_type *)local_90);
      this_local._4_4_ = 0;
    }
    else {
      local_118._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,line);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(&local_118);
      rT.typeOfRelocation.field_2._8_4_ = (ppVar2->second).section;
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>_>_>_>
               ::operator[](&this->relocationTable,&currentSectionName_abi_cxx11_);
      std::__cxx11::
      list<Assembler::relocationTableEntry,_std::allocator<Assembler::relocationTableEntry>_>::
      push_back(pmVar3,(value_type *)local_90);
      local_120._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,line);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(&local_120);
      this_local._4_4_ = (ppVar2->second).value;
    }
    local_10c = 1;
    relocationTableEntry::~relocationTableEntry((relocationTableEntry *)local_90);
  }
  return this_local._4_4_;
}

Assistant:

int Assembler::processAbsoluteAddressingSymbol(string line) {

    if (symbolTable.find(line) != symbolTable.end()) {
        if (symbolTable.find(line)->second.section == -1) return symbolTable.find(line)->second.value;
        else {
            relocationTableEntry rT = relocationTableEntry();
            rT.offset += locationCounter + 3;
            rT.typeOfRelocation = "R_386_16";
            rT.section = currentSectionName;

            if (symbolTable.find(line)->second.isGlobal || (symbolTable.find(line)->second.section == 0)) {
                rT.value = symbolTable.find(line)->second.id;
                relocationTable[currentSectionName].push_back(rT);
                return 0;
            } else {
                rT.value = symbolTable.find(line)->second.section;
                relocationTable[currentSectionName].push_back(rT);
                return symbolTable.find(line)->second.value;
            }
        }

    } else throw NotDefSymbol();
}